

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O1

randomx_dataset * randomx_alloc_dataset(randomx_flags flags)

{
  randomx_dataset *prVar1;
  uint8_t *puVar2;
  
  prVar1 = (randomx_dataset *)operator_new(0x10);
  prVar1->memory = (uint8_t *)0x0;
  prVar1->dealloc = (DatasetDeallocFunc *)0x0;
  if ((flags & RANDOMX_FLAG_LARGE_PAGES) == RANDOMX_FLAG_DEFAULT) {
    prVar1->dealloc = randomx::deallocDataset<randomx::AlignedAllocator<64ul>>;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x81ffffc0);
  }
  else {
    prVar1->dealloc = randomx::deallocDataset<randomx::LargePageAllocator>;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x81ffffc0);
  }
  prVar1->memory = puVar2;
  return prVar1;
}

Assistant:

randomx_dataset *randomx_alloc_dataset(randomx_flags flags) {

		//fail on 32-bit systems if DatasetSize is >= 4 GiB
		if (randomx::DatasetSize > std::numeric_limits<size_t>::max()) {
			return nullptr;
		}

		randomx_dataset *dataset = nullptr;

		try {
			dataset = new randomx_dataset();
			if (flags & RANDOMX_FLAG_LARGE_PAGES) {
				dataset->dealloc = &randomx::deallocDataset<randomx::LargePageAllocator>;
				dataset->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::DatasetSize);
			}
			else {
				dataset->dealloc = &randomx::deallocDataset<randomx::DefaultAllocator>;
				dataset->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::DatasetSize);
			}
		}
		catch (std::exception &ex) {
			if (dataset != nullptr) {
				randomx_release_dataset(dataset);
				dataset = nullptr;
			}
		}

		return dataset;
	}